

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_v2_public.c
# Opt level: O1

int main(void)

{
  char cVar1;
  long lVar2;
  long lVar3;
  uint8_t *footer;
  uint8_t message [5];
  uint8_t foot [7];
  size_t footer_len;
  size_t message_len_dec;
  uint8_t pk [32];
  uint8_t sk [64];
  undefined8 local_a0;
  undefined4 local_98;
  undefined1 local_94;
  undefined4 local_90;
  undefined3 uStack_8c;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78 [32];
  undefined1 local_58 [72];
  
  cVar1 = paseto_init();
  if (cVar1 == '\0') {
    main_cold_1();
LAB_0010134d:
    main_cold_2();
LAB_00101352:
    main_cold_3();
  }
  else {
    cVar1 = paseto_v2_public_load_secret_key_base64
                      (local_58,
                       "mk0Nc8DCn9ZYR1IMqtq9g27CmGP5sNojeasZ1qop7R263gnGUfEo6RAp0OGvYctUoYMzVHoYAcT6Z4_56Tkj1g"
                      );
    if (cVar1 == '\0') goto LAB_0010134d;
    cVar1 = paseto_v2_public_load_public_key_base64
                      (local_78,"ut4JxlHxKOkQKdDhr2HLVKGDM1R6GAHE-meP-ek5I9Y");
    if (cVar1 == '\0') goto LAB_00101352;
    local_94 = 0;
    local_98 = 0x74736574;
    uStack_8c = 0x7265;
    local_90 = 0x746f6f66;
    lVar2 = paseto_v2_public_sign(&local_98,4,local_58,&local_90,6);
    if (lVar2 != 0) {
      printf("signed: %s\n",lVar2);
      local_80 = 0;
      local_88 = 0;
      lVar3 = paseto_v2_public_verify(lVar2,&local_80,local_78,&local_a0);
      if (lVar3 != 0) {
        paseto_free(lVar2);
        printf("verified: %s\nfooter: %s\n",lVar3,local_a0);
        paseto_free(lVar3);
        return 0;
      }
      goto LAB_0010135c;
    }
  }
  main_cold_5();
LAB_0010135c:
  main_cold_4();
  halt_baddata();
}

Assistant:

int main() {
    if (!paseto_init()) {
        fprintf(stderr, "Failed to initialize libpaseto\n");
        exit(-1);
    }

    uint8_t sk[paseto_v2_PUBLIC_SECRETKEYBYTES];
    if (!paseto_v2_public_load_secret_key_base64(sk,
            "mk0Nc8DCn9ZYR1IMqtq9g27CmGP5sNojeasZ1qop7R263gnGUfEo6RAp0OGvYctUoYMzVHoYAcT6Z4_56Tkj1g")) {
        perror("Failed to load secret key");
        exit(-1);
    }
    uint8_t pk[paseto_v2_PUBLIC_PUBLICKEYBYTES];
    if (!paseto_v2_public_load_public_key_base64(pk,
            "ut4JxlHxKOkQKdDhr2HLVKGDM1R6GAHE-meP-ek5I9Y")) {
        perror("Failed to load public key");
        exit(-1);
    }
    const uint8_t message[] = "test";
    size_t message_len = sizeof(message) - 1;
    const uint8_t foot[] = "footer";
    size_t foot_len = sizeof(foot) - 1;
    char *enc = paseto_v2_public_sign(
            message, message_len, sk, foot, foot_len);
    if (!enc) {
        perror("paseto_v2_public_sign failed");
        exit(-1);
    }
    printf("signed: %s\n", enc);

    size_t message_len_dec = 0;
    size_t footer_len = 0;
    uint8_t *footer;
    uint8_t *message_dec = paseto_v2_public_verify(
            enc, &message_len_dec, pk, &footer, &footer_len);
    if (!message_dec) {
        perror("paseto_v2_public_verify failed");
        exit(-1);
    }
    paseto_free(enc);
    printf("verified: %s\nfooter: %s\n", message_dec, footer);
    paseto_free(message_dec);
}